

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conn.c
# Opt level: O2

int conn_in_use(conn_handle *conn)

{
  mutex_handle *mutex;
  int iVar1;
  void *pvVar2;
  
  pvVar2 = conn->priv;
  mutex = (mutex_handle *)((long)pvVar2 + 0x90);
  mutex_lock_shared(mutex);
  iVar1 = *(int *)((long)pvVar2 + 8);
  mutex_unlock_shared(mutex);
  return (int)(iVar1 != -1);
}

Assistant:

int conn_in_use(struct conn_handle *conn)
{
	struct conn_priv *priv = conn->priv;
	int ret = 0;

	mutex_lock_shared(&priv->mutex);

	if (priv->fd != INVALID_SOCKET)
		ret = 1;

	mutex_unlock_shared(&priv->mutex);

	return ret;
}